

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSchemas.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  __off_t __len;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  void *__addr;
  long lVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int local_cc;
  stat info;
  
  local_cc = noout;
  iVar8 = memory;
  iVar9 = debug;
  for (lVar10 = 1; lVar10 < argc; lVar10 = lVar10 + 1) {
    pcVar7 = argv[lVar10];
    iVar2 = strcmp(pcVar7,"-debug");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--debug"), iVar2 == 0)) {
      iVar9 = iVar9 + 1;
      debug = iVar9;
    }
    else {
      iVar2 = strcmp(pcVar7,"-memory");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--memory"), iVar2 == 0)) {
        iVar8 = iVar8 + 1;
        memory = iVar8;
      }
      else {
        iVar2 = strcmp(pcVar7,"-noout");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--noout"), iVar2 == 0)) {
          noout = local_cc + 1;
          local_cc = noout;
        }
      }
    }
  }
  xmlLineNumbersDefault(1);
  lVar6 = 0;
  iVar8 = 0;
  for (lVar10 = 1; lVar10 < argc; lVar10 = lVar10 + 1) {
    pcVar7 = argv[lVar10];
    if (*pcVar7 != '-') {
      if (lVar6 == 0) {
        if (memory == 0) {
          uVar4 = xmlSchemaNewParserCtxt();
          puVar5 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar5;
          puVar5 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetParserErrors(uVar4,uVar1,*puVar5,0);
          lVar6 = xmlSchemaParse(uVar4);
          xmlSchemaFreeParserCtxt(uVar4);
        }
        else {
          iVar9 = stat64(pcVar7,(stat64 *)&info);
          if (((iVar9 < 0) || (iVar9 = open64(argv[lVar10],0), __len = info.st_size, iVar9 < 0)) ||
             (__addr = mmap64((void *)0x0,info.st_size,1,1,iVar9,0),
             __addr == (void *)0xffffffffffffffff)) goto LAB_001015cb;
          uVar4 = xmlSchemaNewMemParserCtxt(__addr,__len & 0xffffffff);
          puVar5 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar5;
          puVar5 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetParserErrors(uVar4,uVar1,*puVar5,0);
          lVar6 = xmlSchemaParse(uVar4);
          xmlSchemaFreeParserCtxt(uVar4);
          munmap(__addr,__len);
        }
        if (debug != 0) {
          xmlSchemaDump(_stdout,lVar6);
        }
        if (lVar6 == 0) goto LAB_00101611;
      }
      else {
        lVar3 = xmlReadFile(pcVar7,0,0);
        if (lVar3 == 0) {
          fprintf(_stderr,"Could not parse %s\n",argv[lVar10]);
        }
        else {
          uVar4 = xmlSchemaNewValidCtxt(lVar6);
          puVar5 = (undefined8 *)__xmlGenericError();
          uVar1 = *puVar5;
          puVar5 = (undefined8 *)__xmlGenericError();
          xmlSchemaSetValidErrors(uVar4,uVar1,*puVar5);
          iVar9 = xmlSchemaValidateDoc(uVar4,lVar3);
          if (iVar9 == 0) {
            pcVar7 = "%s validates\n";
          }
          else if (iVar9 < 1) {
            pcVar7 = "%s validation generated an internal error\n";
          }
          else {
            pcVar7 = "%s fails to validate\n";
          }
          printf(pcVar7);
          xmlSchemaFreeValidCtxt(uVar4);
          xmlFreeDoc(lVar3);
        }
      }
      iVar8 = iVar8 + 1;
    }
  }
  if (lVar6 != 0) {
    xmlSchemaFree(lVar6);
  }
LAB_001015cb:
  if (iVar8 == 0) {
    printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",*argv);
    puts("\tParse the HTML files and output the result of the parsing");
    puts("\t--debug : dump a debug tree of the in-memory document");
    puts("\t--noout : do not print the result");
    puts("\t--memory : test the schemas in memory parsing");
  }
LAB_00101611:
  xmlSchemaCleanupTypes();
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;
    xmlSchemaPtr schema = NULL;

    for (i = 1; i < argc ; i++) {
#ifdef LIBXML_DEBUG_ENABLED
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else
#endif
#ifdef HAVE_MMAP
	if ((!strcmp(argv[i], "-memory")) || (!strcmp(argv[i], "--memory"))) {
	    memory++;
        } else
#endif
	if ((!strcmp(argv[i], "-noout")) || (!strcmp(argv[i], "--noout"))) {
	    noout++;
        }
    }
    xmlLineNumbersDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    if (schema == NULL) {
		xmlSchemaParserCtxtPtr ctxt;

#ifdef HAVE_MMAP
		if (memory) {
		    int fd;
		    struct stat info;
		    const char *base;
		    if (stat(argv[i], &info) < 0)
			break;
		    if ((fd = open(argv[i], O_RDONLY)) < 0)
			break;
		    base = mmap(NULL, info.st_size, PROT_READ,
			        MAP_SHARED, fd, 0) ;
		    if (base == (void *) MAP_FAILED)
			break;

		    ctxt = xmlSchemaNewMemParserCtxt((char *)base,info.st_size);

		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		    munmap((char *) base, info.st_size);
		} else
#endif
		{
		    ctxt = xmlSchemaNewParserCtxt(argv[i]);
		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		}
#ifdef LIBXML_OUTPUT_ENABLED
#ifdef LIBXML_DEBUG_ENABLED
		if (debug)
		    xmlSchemaDump(stdout, schema);
#endif
#endif /* LIBXML_OUTPUT_ENABLED */
		if (schema == NULL)
		    goto failed_schemas;
	    } else {
		xmlDocPtr doc;

		doc = xmlReadFile(argv[i],NULL,0);

		if (doc == NULL) {
		    fprintf(stderr, "Could not parse %s\n", argv[i]);
		} else {
		    xmlSchemaValidCtxtPtr ctxt;
		    int ret;

		    ctxt = xmlSchemaNewValidCtxt(schema);
		    xmlSchemaSetValidErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    ret = xmlSchemaValidateDoc(ctxt, doc);
		    if (ret == 0) {
			printf("%s validates\n", argv[i]);
		    } else if (ret > 0) {
			printf("%s fails to validate\n", argv[i]);
		    } else {
			printf("%s validation generated an internal error\n",
			       argv[i]);
		    }
		    xmlSchemaFreeValidCtxt(ctxt);
		    xmlFreeDoc(doc);
		}
	    }
	    files ++;
	}
    }
    if (schema != NULL)
	xmlSchemaFree(schema);
    if (files == 0) {
	printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",
	       argv[0]);
	printf("\tParse the HTML files and output the result of the parsing\n");
#ifdef LIBXML_DEBUG_ENABLED
	printf("\t--debug : dump a debug tree of the in-memory document\n");
#endif
	printf("\t--noout : do not print the result\n");
#ifdef HAVE_MMAP
	printf("\t--memory : test the schemas in memory parsing\n");
#endif
    }
failed_schemas:
    xmlSchemaCleanupTypes();
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}